

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quick_status_code_from_enum.hpp
# Opt level: O1

bool __thiscall
system_error2::_quick_status_code_from_enum_domain<another_namespace::AnotherCode>::_do_equivalent
          (_quick_status_code_from_enum_domain<another_namespace::AnotherCode> *this,
          status_code<void> *code1,status_code<void> *code2)

{
  mapping *i;
  long lVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  
  if (*(long *)(code1->_domain + 8) != *(long *)&this->field_0x8) {
    __assert_fail("code1.domain() == *this",
                  "/workspace/llm4binary/github/license_c_cmakelists/ned14[P]status-code/include/status-code/quick_status_code_from_enum.hpp"
                  ,0x8f,
                  "virtual bool system_error2::_quick_status_code_from_enum_domain<another_namespace::AnotherCode>::_do_equivalent(const status_code<void> &, const status_code<void> &) const [Enum = another_namespace::AnotherCode]"
                 );
  }
  if (*(long *)(code2->_domain + 8) == *(long *)&this->field_0x8) {
    bVar3 = code1[1]._domain == code2[1]._domain;
  }
  else {
    if (*(long *)(code2->_domain + 8) == 0x746d6354f4f733e9) {
      lVar2 = 0;
      do {
        lVar1 = (long)&quick_status_code_from_enum<another_namespace::AnotherCode>::value_mappings()
                       ::v + lVar2;
        if (*(status_code_domain **)
             ((long)&quick_status_code_from_enum<another_namespace::AnotherCode>::value_mappings()::
                     v + lVar2) == code1[1]._domain) goto LAB_001015f1;
        lVar2 = lVar2 + 0x20;
      } while (lVar2 != 0x80);
      lVar1 = 0;
LAB_001015f1:
      if (lVar1 == 0) {
        __assert_fail("mapping != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/ned14[P]status-code/include/status-code/quick_status_code_from_enum.hpp"
                      ,0x9b,
                      "virtual bool system_error2::_quick_status_code_from_enum_domain<another_namespace::AnotherCode>::_do_equivalent(const status_code<void> &, const status_code<void> &) const [Enum = another_namespace::AnotherCode]"
                     );
      }
      if (*(long *)(lVar1 + 0x18) != 0) {
        lVar2 = 0;
        do {
          bVar3 = *(int *)(*(long *)(lVar1 + 0x10) + lVar2) == *(int *)&code2[1]._domain;
          if (bVar3) {
            return bVar3;
          }
          bVar4 = *(long *)(lVar1 + 0x18) * 4 + -4 != lVar2;
          lVar2 = lVar2 + 4;
        } while (bVar4);
        return bVar3;
      }
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

virtual bool _do_equivalent(const status_code<void> &code1, const status_code<void> &code2) const noexcept override
  {
    assert(code1.domain() == *this);                                                            // NOLINT
    const auto &c1 = static_cast<const quick_status_code_from_enum_code<value_type> &>(code1);  // NOLINT
    if(code2.domain() == *this)
    {
      const auto &c2 = static_cast<const quick_status_code_from_enum_code<value_type> &>(code2);  // NOLINT
      return c1.value() == c2.value();
    }
    if(code2.domain() == generic_code_domain)
    {
      const auto &c2 = static_cast<const generic_code &>(code2);  // NOLINT
      const auto *mapping = _find_mapping(c1.value());
#if SYSTEM_ERROR2_QUICK_STATUS_CODE_FROM_ENUM_ASSERT_ON_MISSING_MAPPING_TABLE_ENTRIES
      assert(mapping != nullptr);  // if this fires, you forgot to add the enum to the mapping table
#endif
      if(mapping != nullptr)
      {
        for(errc ec : mapping->code_mappings)
        {
          if(ec == c2.value())
          {
            return true;
          }
        }
      }
    }
    return false;
  }